

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O2

void FT_Stroker_Done(FT_Stroker stroker)

{
  FT_Memory memory;
  
  if (stroker != (FT_Stroker)0x0) {
    memory = stroker->library->memory;
    ft_stroke_border_done(stroker->borders);
    ft_stroke_border_done(stroker->borders + 1);
    stroker->library = (FT_Library)0x0;
    ft_mem_free(memory,stroker);
    return;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Stroker_Done( FT_Stroker  stroker )
  {
    if ( stroker )
    {
      FT_Memory  memory = stroker->library->memory;


      ft_stroke_border_done( &stroker->borders[0] );
      ft_stroke_border_done( &stroker->borders[1] );

      stroker->library = NULL;
      FT_FREE( stroker );
    }
  }